

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c
# Opt level: O0

void mutex_prof_data_init(mutex_prof_data_t *data)

{
  nstime_t *in_RDI;
  nstime_t *in_stack_fffffffffffffff0;
  
  memset(in_RDI,0,0x40);
  duckdb_je_nstime_copy(in_stack_fffffffffffffff0,in_RDI);
  duckdb_je_nstime_copy(in_RDI,in_RDI);
  in_RDI[6].ns = 0;
  return;
}

Assistant:

static void
mutex_prof_data_init(mutex_prof_data_t *data) {
	memset(data, 0, sizeof(mutex_prof_data_t));
	nstime_init_zero(&data->max_wait_time);
	nstime_init_zero(&data->tot_wait_time);
	data->prev_owner = NULL;
}